

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validationinterface.cpp
# Opt level: O0

void __thiscall
ValidationSignals::MempoolTransactionsRemovedForBlock
          (ValidationSignals *this,
          vector<RemovedMempoolTransactionInfo,_std::allocator<RemovedMempoolTransactionInfo>_>
          *txs_removed_for_block,uint nBlockHeight)

{
  bool bVar1;
  pointer pTVar2;
  undefined4 in_EDX;
  undefined8 in_RSI;
  vector<RemovedMempoolTransactionInfo,_std::allocator<RemovedMempoolTransactionInfo>_> *in_RDI;
  long in_FS_OFFSET;
  Level in_stack_00000050;
  char **in_stack_00000060;
  uint *in_stack_00000068;
  char *local_name;
  anon_class_40_3_9e0b9ba9_for_event event;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  char *in_stack_fffffffffffffeb0;
  anon_class_40_3_9e0b9ba9_for_event *in_stack_fffffffffffffeb8;
  anon_class_80_4_edf05079 *in_stack_fffffffffffffec0;
  _Any_data *in_stack_fffffffffffffec8;
  anon_class_40_3_9e0b9ba9_for_event *in_stack_ffffffffffffff00;
  LogFlags in_stack_ffffffffffffff10;
  int source_line;
  ConstevalFormatString<3U> in_stack_ffffffffffffff58;
  string_view in_stack_ffffffffffffff60;
  string_view in_stack_ffffffffffffff70;
  _Any_data local_68 [2];
  anon_class_40_3_9e0b9ba9_for_event local_40;
  undefined4 local_c;
  long local_8;
  
  source_line = (int)((ulong)in_RSI >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = in_EDX;
  std::vector<RemovedMempoolTransactionInfo,_std::allocator<RemovedMempoolTransactionInfo>_>::vector
            (&in_stack_ffffffffffffff00->txs_removed_for_block,in_RDI);
  local_40.this._0_4_ = local_c;
  local_40.txs_removed_for_block.
  super__Vector_base<RemovedMempoolTransactionInfo,_std::allocator<RemovedMempoolTransactionInfo>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x1d3ae00;
  bVar1 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),Trace);
  if (bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffec8,
               (char *)in_stack_fffffffffffffec0);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffec8,
               (char *)in_stack_fffffffffffffec0);
    in_stack_fffffffffffffeb0 = "Enqueuing %s: block height=%s txs removed=%s\n";
    local_68[0]._0_8_ =
         std::vector<RemovedMempoolTransactionInfo,_std::allocator<RemovedMempoolTransactionInfo>_>
         ::size((vector<RemovedMempoolTransactionInfo,_std::allocator<RemovedMempoolTransactionInfo>_>
                 *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    in_stack_fffffffffffffec8 = local_68;
    in_stack_fffffffffffffec0 = (anon_class_80_4_edf05079 *)&stack0xfffffffffffffff4;
    in_stack_fffffffffffffeb8 = &local_40;
    in_stack_fffffffffffffea8 = 1;
    in_stack_ffffffffffffff00 = (anon_class_40_3_9e0b9ba9_for_event *)in_stack_fffffffffffffeb0;
    LogPrintFormatInternal<char_const*,unsigned_int,unsigned_long>
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff60,source_line,
               in_stack_ffffffffffffff10,in_stack_00000050,in_stack_ffffffffffffff58,
               in_stack_00000060,in_stack_00000068,(unsigned_long *)txs_removed_for_block);
  }
  std::unique_ptr<ValidationSignalsImpl,_std::default_delete<ValidationSignalsImpl>_>::operator->
            ((unique_ptr<ValidationSignalsImpl,_std::default_delete<ValidationSignalsImpl>_> *)
             CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  pTVar2 = std::
           unique_ptr<util::TaskRunnerInterface,_std::default_delete<util::TaskRunnerInterface>_>::
           operator->((unique_ptr<util::TaskRunnerInterface,_std::default_delete<util::TaskRunnerInterface>_>
                       *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  std::vector<RemovedMempoolTransactionInfo,_std::allocator<RemovedMempoolTransactionInfo>_>::vector
            (&in_stack_ffffffffffffff00->txs_removed_for_block,in_RDI);
  MempoolTransactionsRemovedForBlock(std::vector<RemovedMempoolTransactionInfo,std::allocator<RemovedMempoolTransactionInfo>>const&,unsigned_int)
  ::$_1::__1(in_stack_fffffffffffffeb8,
             (anon_class_40_3_9e0b9ba9_for_event *)in_stack_fffffffffffffeb0);
  std::function<void()>::
  function<ValidationSignals::MempoolTransactionsRemovedForBlock(std::vector<RemovedMempoolTransactionInfo,std::allocator<RemovedMempoolTransactionInfo>>const&,unsigned_int)::__0,void>
            ((function<void_()> *)in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  (*pTVar2->_vptr_TaskRunnerInterface[2])(pTVar2,&stack0xffffffffffffff78);
  std::function<void_()>::~function
            ((function<void_()> *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  MempoolTransactionsRemovedForBlock(std::vector<RemovedMempoolTransactionInfo,std::allocator<RemovedMempoolTransactionInfo>>const&,unsigned_int)
  ::$_0::~__0((anon_class_80_4_edf05079 *)
              CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  MempoolTransactionsRemovedForBlock(std::vector<RemovedMempoolTransactionInfo,std::allocator<RemovedMempoolTransactionInfo>>const&,unsigned_int)
  ::$_1::~__1((anon_class_40_3_9e0b9ba9_for_event *)
              CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void ValidationSignals::MempoolTransactionsRemovedForBlock(const std::vector<RemovedMempoolTransactionInfo>& txs_removed_for_block, unsigned int nBlockHeight)
{
    auto event = [txs_removed_for_block, nBlockHeight, this] {
        m_internals->Iterate([&](CValidationInterface& callbacks) { callbacks.MempoolTransactionsRemovedForBlock(txs_removed_for_block, nBlockHeight); });
    };
    ENQUEUE_AND_LOG_EVENT(event, "%s: block height=%s txs removed=%s", __func__,
                          nBlockHeight,
                          txs_removed_for_block.size());
}